

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

int cdef_find_dir_avx2(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  long lVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  v128 alVar15;
  undefined1 auVar16 [16];
  int32_t cost [8];
  v128 lines [8];
  int32_t local_b8 [4];
  int32_t local_a8 [4];
  v128 local_98;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  
  auVar14 = ZEXT416((uint)coeff_shift);
  auVar16._8_2_ = 0xff80;
  auVar16._0_8_ = 0xff80ff80ff80ff80;
  auVar16._10_2_ = 0xff80;
  auVar16._12_2_ = 0xff80;
  auVar16._14_2_ = 0xff80;
  for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 0x10) {
    auVar2 = vlddqu_avx(*(undefined1 (*) [16])img);
    auVar2 = vpsraw_avx(auVar2,ZEXT416((uint)coeff_shift));
    auVar2 = vpaddw_avx(auVar2,auVar16);
    *(undefined1 (*) [16])((long)local_98 + lVar12) = auVar2;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
  }
  compute_directions(&local_98,local_a8);
  auVar5 = vpunpcklwd_avx((undefined1  [16])local_98,local_88);
  auVar6 = vpunpcklwd_avx(local_78,local_68);
  auVar16 = vpunpckhwd_avx((undefined1  [16])local_98,local_88);
  auVar2 = vpunpckhwd_avx(local_78,local_68);
  auVar7 = vpunpcklwd_avx(local_58,local_48);
  auVar8 = vpunpcklwd_avx(local_38,local_28);
  auVar3 = vpunpckhwd_avx(local_58,local_48);
  auVar4 = vpunpckhwd_avx(local_38,local_28);
  auVar9 = vpunpckldq_avx(auVar5,auVar6);
  auVar10 = vpunpckldq_avx(auVar7,auVar8);
  auVar5 = vpunpckhdq_avx(auVar5,auVar6);
  auVar6 = vpunpckhdq_avx(auVar7,auVar8);
  auVar7 = vpunpckldq_avx(auVar16,auVar2);
  auVar8 = vpunpckldq_avx(auVar3,auVar4);
  auVar16 = vpunpckhdq_avx(auVar16,auVar2);
  auVar2 = vpunpckhdq_avx(auVar3,auVar4);
  local_28 = vpunpcklqdq_avx(auVar9,auVar10);
  local_38 = vpunpckhqdq_avx(auVar9,auVar10);
  local_48 = vpunpcklqdq_avx(auVar5,auVar6);
  local_58 = vpunpckhqdq_avx(auVar5,auVar6);
  local_68 = vpunpcklqdq_avx(auVar7,auVar8);
  local_78 = vpunpckhqdq_avx(auVar7,auVar8);
  local_88 = vpunpcklqdq_avx(auVar16,auVar2);
  alVar15 = (v128)vpunpckhqdq_avx(auVar16,auVar2);
  local_98 = alVar15;
  compute_directions(&local_98,local_b8);
  auVar16 = vpmaxsd_avx((undefined1  [16])alVar15,auVar14);
  auVar2 = vpshufd_avx(auVar16,0x4e);
  auVar16 = vpmaxsd_avx(auVar16,auVar2);
  auVar2 = vpshufd_avx(auVar16,0x39);
  auVar2 = vpmaxsd_avx(auVar16,auVar2);
  auVar14 = vpcmpeqd_avx(auVar2,auVar14);
  auVar16 = vpcmpeqd_avx(auVar2,(undefined1  [16])alVar15);
  auVar14 = vpackssdw_avx(auVar16,auVar14);
  auVar14 = vpacksswb_avx(auVar14,auVar14);
  uVar11 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
           (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
           (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
           (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
           (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
           (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
           (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
           (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
           (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
           (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
           (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
           (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
           (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
           (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar14[0xf] >> 7) << 0xf
  ;
  uVar13 = uVar11 - 1 ^ (uint)uVar11;
  uVar1 = 0x1f;
  if (uVar13 != 0) {
    for (; uVar13 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  *var = auVar2._0_4_ - local_b8[uVar1 & 7 ^ 4] >> 10;
  return uVar1;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}